

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TtManStop(Abc_TtMan_t *p)

{
  Vec_Mem_t *pVVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    pVVar1 = p->vTtMem[lVar4];
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      if (pVVar1->vTable != (Vec_Int_t *)0x0) {
        piVar2 = pVVar1->vTable->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pVVar1->vTable->pArray = (int *)0x0;
        }
        if (pVVar1->vTable != (Vec_Int_t *)0x0) {
          free(pVVar1->vTable);
          pVVar1->vTable = (Vec_Int_t *)0x0;
        }
      }
      if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
        piVar2 = pVVar1->vNexts->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pVVar1->vNexts->pArray = (int *)0x0;
        }
        if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
          free(pVVar1->vNexts);
          pVVar1->vNexts = (Vec_Int_t *)0x0;
        }
      }
    }
    pVVar1 = p->vTtMem[lVar4];
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      if (-1 < pVVar1->iPage) {
        lVar3 = -1;
        do {
          if (pVVar1->ppPages[lVar3 + 1] != (word *)0x0) {
            free(pVVar1->ppPages[lVar3 + 1]);
            pVVar1->ppPages[lVar3 + 1] = (word *)0x0;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < pVVar1->iPage);
      }
      if (pVVar1->ppPages != (word **)0x0) {
        free(pVVar1->ppPages);
        pVVar1->ppPages = (word **)0x0;
      }
      free(pVVar1);
      p->vTtMem[lVar4] = (Vec_Mem_t *)0x0;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (p != (Abc_TtMan_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Abc_TtManStop( Abc_TtMan_t * p )
{
    int i;
    for ( i = 0; i < TT_NUM_TABLES; i++ )
    {
        Vec_MemHashFree( p->vTtMem[i] );
        Vec_MemFreeP( &p->vTtMem[i] );
    }
    ABC_FREE( p );
}